

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

Vector2f __thiscall sf::Text::findCharacterPos(Text *this,size_t index)

{
  float fVar1;
  Uint32 second;
  size_t sVar2;
  Glyph *pGVar3;
  Transform *this_00;
  bool bold;
  String *this_01;
  size_t i;
  Uint32 first;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector2f VVar7;
  float fVar8;
  float fVar9;
  float local_58;
  Vector2f local_38;
  
  if (this->m_font == (Font *)0x0) {
    VVar7.x = 0.0;
    VVar7.y = 0.0;
  }
  else {
    this_01 = &this->m_string;
    sVar2 = String::getSize(this_01);
    if (sVar2 < index) {
      index = String::getSize(this_01);
    }
    bold = (bool)((byte)this->m_style & 1);
    local_58 = 0.0;
    pGVar3 = Font::getGlyph(this->m_font,0x20,this->m_characterSize,bold,0.0);
    fVar8 = (this->m_letterSpacingFactor + -1.0) * (pGVar3->advance / 3.0);
    fVar9 = pGVar3->advance + fVar8;
    fVar4 = Font::getLineSpacing(this->m_font,this->m_characterSize);
    fVar1 = this->m_lineSpacingFactor;
    fVar5 = 0.0;
    first = 0;
    for (sVar2 = 0; index != sVar2; sVar2 = sVar2 + 1) {
      second = String::operator[](this_01,sVar2);
      fVar6 = Font::getKerning(this->m_font,first,second,this->m_characterSize,bold);
      fVar6 = fVar6 + fVar5;
      if (second == 9) {
        fVar5 = fVar6 + fVar9 * 4.0;
      }
      else if (second == 10) {
        local_58 = local_58 + fVar4 * fVar1;
        fVar5 = 0.0;
      }
      else if (second == 0x20) {
        fVar5 = fVar6 + fVar9;
      }
      else {
        pGVar3 = Font::getGlyph(this->m_font,second,this->m_characterSize,bold,0.0);
        fVar5 = fVar6 + pGVar3->advance + fVar8;
      }
      first = second;
    }
    local_38.y = local_58;
    local_38.x = fVar5;
    this_00 = Transformable::getTransform(&this->super_Transformable);
    VVar7 = Transform::transformPoint(this_00,&local_38);
  }
  return VVar7;
}

Assistant:

Vector2f Text::findCharacterPos(std::size_t index) const
{
    // Make sure that we have a valid font
    if (!m_font)
        return Vector2f();

    // Adjust the index if it's out of range
    if (index > m_string.getSize())
        index = m_string.getSize();

    // Precompute the variables needed by the algorithm
    bool  isBold          = m_style & Bold;
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;

    // Compute the position
    Vector2f position;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < index; ++i)
    {
        Uint32 curChar = m_string[i];

        // Apply the kerning offset
        position.x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);
        prevChar = curChar;

        // Handle special characters
        switch (curChar)
        {
            case ' ':  position.x += whitespaceWidth;             continue;
            case '\t': position.x += whitespaceWidth * 4;         continue;
            case '\n': position.y += lineSpacing; position.x = 0; continue;
        }

        // For regular characters, add the advance offset of the glyph
        position.x += m_font->getGlyph(curChar, m_characterSize, isBold).advance + letterSpacing;
    }

    // Transform the position to global coordinates
    position = getTransform().transformPoint(position);

    return position;
}